

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O1

void __thiscall PureArrayFactory::PureArrayFactory(PureArrayFactory *this,int range,int w,int h)

{
  Array **ppAVar1;
  ulong uVar2;
  
  this->_vptr_PureArrayFactory = (_func_int **)&PTR__PureArrayFactory_00104da0;
  this->_range = range;
  this->_width = w;
  this->_height = h;
  uVar2 = 0xffffffffffffffff;
  if (-1 < range) {
    uVar2 = (long)range * 8;
  }
  ppAVar1 = (Array **)operator_new__(uVar2);
  this->_arrays = ppAVar1;
  if (0 < range) {
    uVar2 = 0;
    do {
      this->_arrays[uVar2] = (Array *)0x0;
      uVar2 = uVar2 + 1;
    } while ((uint)range != uVar2);
  }
  return;
}

Assistant:

PureArrayFactory::PureArrayFactory(int range, int w, int h)
	:_range(range)
	,_width(w)
	,_height(h)
{
	_arrays = new Array*[_range];

	for (int i = 0; i < _range; ++i) {
		_arrays[i] = NULL;
	}
}